

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cpp
# Opt level: O2

void load_circuit(Circuit *C,string *location,bool verbose)

{
  ostream *poVar1;
  runtime_error *this;
  undefined7 in_register_00000011;
  ifstream inpf;
  byte abStack_208 [488];
  
  if ((int)CONCAT71(in_register_00000011,verbose) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Loading circuit from location ");
    poVar1 = std::operator<<(poVar1,(string *)location);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::ifstream::ifstream(&inpf,(string *)location,_S_in);
  if ((abStack_208[*(long *)(_inpf + -0x18)] & 5) == 0) {
    operator>>((istream *)&inpf,C);
    std::ifstream::close();
    if (verbose) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Finished loading circuit");
      std::endl<char,std::char_traits<char>>(poVar1);
    }
    std::ifstream::~ifstream(&inpf);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"file location");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void load_circuit(Circuit &C, const string &location, bool verbose = false) {
  if (verbose) {
    cout << "Loading circuit from location " << location << endl;
  }
  std::ifstream inpf(location);
  if (inpf.fail()) {
    throw std::runtime_error("file location");
  }
  inpf >> C;
  inpf.close();

  if (verbose) {
    cout << "Finished loading circuit" << endl;
  }
}